

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

string * fs_as_posix_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  _Bool _Var1;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view path_local;
  string *s;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  local_21 = 0;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_22);
  std::allocator<char>::~allocator(&local_22);
  _Var1 = fs_is_windows();
  if (_Var1) {
    local_40._M_current = (char *)std::__cxx11::string::begin();
    local_48 = (char *)std::__cxx11::string::end();
    local_4a[1] = 0x5c;
    local_4a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_48,local_4a + 1,local_4a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_as_posix(std::string_view path)
{
  std::string s(path);

  if(fs_is_windows())
    std::replace(s.begin(), s.end(), '\\', '/');

  return s;
}